

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O1

void __thiscall HDual::major_updateFtranPrepare(HDual *this)

{
  int iVar1;
  HVector *pHVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  HVector_ptr *ppHVar8;
  double dVar9;
  
  HVector::clear(&this->columnBFRT);
  if (0 < this->multi_nFinish) {
    uVar7 = 0;
    do {
      pHVar2 = this->multi_finish[uVar7].columnBFRT;
      HMatrix::collect_aj(this->matrix,pHVar2,this->multi_finish[uVar7].columnIn,
                          this->multi_finish[uVar7].thetaPrimal);
      uVar5 = uVar7;
      if (uVar7 != 0) {
        do {
          uVar4 = uVar5 - 1 & 0xffffffff;
          if ((long)pHVar2->count < 1) {
            dVar9 = 0.0;
          }
          else {
            dVar9 = 0.0;
            lVar6 = 0;
            do {
              iVar1 = (pHVar2->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6];
              dVar9 = dVar9 + (pHVar2->array).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[iVar1] *
                              ((this->multi_finish[uVar4].row_ep)->array).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar1];
              lVar6 = lVar6 + 1;
            } while (pHVar2->count != lVar6);
          }
          if (1e-14 < ABS(dVar9)) {
            dVar9 = dVar9 / this->multi_finish[uVar4].alphaRow;
            HMatrix::collect_aj(this->matrix,pHVar2,this->multi_finish[uVar4].columnIn,-dVar9);
            HMatrix::collect_aj(this->matrix,pHVar2,this->multi_finish[uVar4].columnOut,dVar9);
          }
          bVar3 = 1 < (long)uVar5;
          uVar5 = uVar5 - 1;
        } while (bVar3);
      }
      HVector::saxpy(&this->columnBFRT,1.0,pHVar2);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)this->multi_nFinish);
  }
  if (0 < this->multi_nFinish) {
    ppHVar8 = &this->multi_finish[0].column;
    lVar6 = 0;
    do {
      pHVar2 = *ppHVar8;
      HVector::clear(pHVar2);
      pHVar2->packFlag = true;
      HMatrix::collect_aj(this->matrix,pHVar2,*(int *)(ppHVar8 + -7),1.0);
      lVar6 = lVar6 + 1;
      ppHVar8 = ppHVar8 + 0xf;
    } while (lVar6 < this->multi_nFinish);
  }
  return;
}

Assistant:

void HDual::major_updateFtranPrepare() {
    // Prepare FTRAN BFRT buffer
    columnBFRT.clear();
    for (int iFn = 0; iFn < multi_nFinish; iFn++) {
        MFinish *Fin = &multi_finish[iFn];
        HVector *Vec = Fin->columnBFRT;
        matrix->collect_aj(*Vec, Fin->columnIn, Fin->thetaPrimal);

        // Update this buffer by previous Row_ep
        for (int jFn = iFn - 1; jFn >= 0; jFn--) {
            MFinish *jFinish = &multi_finish[jFn];
            double *jRow_epArray = &jFinish->row_ep->array[0];
            double pivotX = 0;
            for (int k = 0; k < Vec->count; k++) {
                int iRow = Vec->index[k];
                pivotX += Vec->array[iRow] * jRow_epArray[iRow];
            }
            if (fabs(pivotX) > HSOL_CONST_TINY) {
                pivotX /= jFinish->alphaRow;
                matrix->collect_aj(*Vec, jFinish->columnIn, -pivotX);
                matrix->collect_aj(*Vec, jFinish->columnOut, pivotX);
            }
        }
        columnBFRT.saxpy(1, Vec);
    }

    // Prepare regular FTRAN buffer
    for (int iFn = 0; iFn < multi_nFinish; iFn++) {
        MFinish *iFinish = &multi_finish[iFn];
        HVector *iColumn = iFinish->column;
        iColumn->clear();
        iColumn->packFlag = true;
        matrix->collect_aj(*iColumn, iFinish->columnIn, 1);
    }

}